

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFPageObjectHelper::addPageContents
          (QPDFPageObjectHelper *this,QPDFObjectHandle *contents,bool first)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)contents);
  QPDFObjectHandle::addPageContents
            ((QPDFObjectHandle *)&local_30,(QPDFObjectHandle *)&local_40,first);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void
QPDFPageObjectHelper::addPageContents(QPDFObjectHandle contents, bool first)
{
    oh().addPageContents(contents, first);
}